

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_common.c
# Opt level: O2

void keyboard_default(mfb_window *window,mfb_key key,mfb_key_mod mod,_Bool isPressed)

{
  char cVar1;
  SWindowData *window_data;
  
  if ((key == KB_KEY_ESCAPE) &&
     ((*(code **)(window + 0x20) == (code *)0x0 ||
      (cVar1 = (**(code **)(window + 0x20))(window), cVar1 != '\0')))) {
    window[0x2aa] = (mfb_window)0x1;
  }
  return;
}

Assistant:

void
keyboard_default(struct mfb_window *window, mfb_key key, mfb_key_mod mod, bool isPressed) {
    kUnused(mod);
    kUnused(isPressed);
    if (key == KB_KEY_ESCAPE) {
        SWindowData *window_data = (SWindowData *) window;
        if (!window_data->close_func || window_data->close_func((struct mfb_window*)window_data)) {
            window_data->close = true;
        }
    }
}